

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::XmlReporter::testRunStarting(XmlReporter *this,TestRunInfo *testInfo)

{
  XmlWriter *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  string stylesheetRef;
  string local_98;
  string local_78;
  ScopedElement local_58;
  uint local_44;
  string local_40;
  
  Option<Catch::TestRunInfo>::operator=
            (&(this->super_StreamingReporterBase<Catch::XmlReporter>).currentTestRunInfo.
              super_Option<Catch::TestRunInfo>,testInfo);
  (this->super_StreamingReporterBase<Catch::XmlReporter>).currentTestRunInfo.used = false;
  (*(this->super_StreamingReporterBase<Catch::XmlReporter>).super_IStreamingReporter.
    _vptr_IStreamingReporter[0x12])(&local_40,this);
  if ((pointer)local_40._M_string_length != (pointer)0x0) {
    XmlWriter::writeStylesheetRef(&this->m_xml,&local_40);
  }
  paVar1 = &local_98.field_2;
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"Catch","");
  this_00 = &this->m_xml;
  XmlWriter::startElement(this_00,&local_98,Newline|Indent);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  (*(((this->super_StreamingReporterBase<Catch::XmlReporter>).m_config.
      super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    super_NonCopyable)._vptr_NonCopyable[4])(&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if (local_98._M_string_length != 0) {
    local_98._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"name","");
    (*(((this->super_StreamingReporterBase<Catch::XmlReporter>).m_config.
        super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      super_NonCopyable)._vptr_NonCopyable[4])(&local_78);
    XmlWriter::writeAttribute(this_00,&local_98,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar1) {
      operator_delete(local_98._M_dataplus._M_p);
    }
  }
  iVar2 = (*(((this->super_StreamingReporterBase<Catch::XmlReporter>).m_config.
              super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_NonCopyable)._vptr_NonCopyable[0xd])();
  if (*(long *)CONCAT44(extraout_var,iVar2) != ((long *)CONCAT44(extraout_var,iVar2))[1]) {
    local_98._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"filters","");
    iVar2 = (*(((this->super_StreamingReporterBase<Catch::XmlReporter>).m_config.
                super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_NonCopyable)._vptr_NonCopyable[0x10])();
    serializeFilters(&local_78,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)CONCAT44(extraout_var_00,iVar2));
    XmlWriter::writeAttribute(this_00,&local_98,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar1) {
      operator_delete(local_98._M_dataplus._M_p);
    }
  }
  iVar2 = (*(((this->super_StreamingReporterBase<Catch::XmlReporter>).m_config.
              super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_NonCopyable)._vptr_NonCopyable[0x12])();
  if (iVar2 != 0) {
    local_98._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"Randomness","");
    XmlWriter::scopedElement((XmlWriter *)&local_58,(string *)this_00,(XmlFormatting)&local_98);
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"seed","");
    local_44 = (*(((this->super_StreamingReporterBase<Catch::XmlReporter>).m_config.
                   super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 super_NonCopyable)._vptr_NonCopyable[0x12])();
    XmlWriter::writeAttribute<unsigned_int>(local_58.m_writer,&local_78,&local_44);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    XmlWriter::ScopedElement::~ScopedElement(&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar1) {
      operator_delete(local_98._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return;
}

Assistant:

void XmlReporter::testRunStarting( TestRunInfo const& testInfo ) {
        StreamingReporterBase::testRunStarting( testInfo );
        std::string stylesheetRef = getStylesheetRef();
        if( !stylesheetRef.empty() )
            m_xml.writeStylesheetRef( stylesheetRef );
        m_xml.startElement( "Catch" );
        if( !m_config->name().empty() )
            m_xml.writeAttribute( "name", m_config->name() );
        if (m_config->testSpec().hasFilters())
            m_xml.writeAttribute( "filters", serializeFilters( m_config->getTestsOrTags() ) );
        if( m_config->rngSeed() != 0 )
            m_xml.scopedElement( "Randomness" )
                .writeAttribute( "seed", m_config->rngSeed() );
    }